

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ewmh.c
# Opt level: O0

void ewmh_update_desktop_names(natwm_state *state,workspace_list *list)

{
  char *__s;
  theme *ptVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  size_t __n;
  void *__dest;
  undefined8 uStack_88;
  undefined8 auStack_80 [2];
  long local_70;
  natwm_state *local_68;
  workspace_list *local_60;
  size_t local_50;
  size_t name_length;
  char *name;
  size_t i;
  size_t pos;
  unsigned_long __vla_expr0;
  workspace_list *local_18;
  workspace_list *list_local;
  natwm_state *state_local;
  
  __vla_expr0 = (unsigned_long)auStack_80;
  auStack_80[0] = 0x10b525;
  local_68 = state;
  local_60 = list;
  local_18 = list;
  list_local = (workspace_list *)state;
  if (list->count == 0) {
    uStack_88 = 0x10b558;
    xcb_ewmh_set_desktop_names(state->ewmh,state->screen_num,0,0);
  }
  else {
    pos = list->count * 0x33;
    lVar2 = -(pos + 0xf & 0xfffffffffffffff0);
    local_70 = (long)auStack_80 + lVar2;
    i = 0;
    for (name = (char *)0x0; lVar5 = local_70, name < (char *)local_18->count; name = name + 1) {
      __s = local_18->workspaces[(long)name]->name;
      name_length = (size_t)__s;
      *(undefined8 *)((long)auStack_80 + lVar2 + -8) = 0x10b5cb;
      __n = strlen(__s);
      sVar4 = name_length;
      __dest = (void *)(local_70 + i);
      local_50 = __n;
      *(undefined8 *)((long)auStack_80 + lVar2 + -8) = 0x10b5e4;
      memcpy(__dest,(void *)sVar4,__n);
      *(undefined1 *)(local_70 + i + local_50) = 0;
      i = local_50 + 1 + i;
    }
    ptVar1 = list_local->theme;
    sVar4 = list_local->count;
    iVar3 = (int)i;
    *(undefined8 *)((long)auStack_80 + lVar2 + -8) = 0x10b633;
    xcb_ewmh_set_desktop_names(ptVar1,(int)sVar4,iVar3 + -1,lVar5);
  }
  return;
}

Assistant:

void ewmh_update_desktop_names(const struct natwm_state *state, const struct workspace_list *list)
{
        // Should never happen
        if (list->count < 1) {
                xcb_ewmh_set_desktop_names(state->ewmh, state->screen_num, 0, NULL);

                return;
        }

        char names[(NATWM_WORKSPACE_NAME_MAX_LEN * list->count) + list->count];
        size_t pos = 0;

        for (size_t i = 0; i < list->count; ++i) {
                const char *name = list->workspaces[i]->name;
                size_t name_length = strlen(name);

                memcpy(names + pos, name, name_length);

                names[pos + name_length] = '\0';

                pos += (name_length + 1);
        }

        xcb_ewmh_set_desktop_names(state->ewmh, state->screen_num, (uint32_t)(pos - 1), names);
}